

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnf.hpp
# Opt level: O1

void bal::Cnf::print_clause(ostream *stream,uint32_t *p_clause,char *final_token)

{
  uint uVar1;
  size_t sVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  char *pcVar7;
  literal_t local_48;
  literal_t local_44;
  ulong local_40;
  ulong local_38;
  
  uVar1 = *p_clause;
  uVar5 = (ulong)(ushort)uVar1;
  if (uVar1 < 0x10000 || 4 < (uVar1 & 0xffff)) {
    if ((uVar1 & 0xffff) != 0) {
      uVar4 = 0;
      do {
        pcVar7 = "";
        if (uVar4 != 0) {
          pcVar7 = " ";
        }
        std::__ostream_insert<char,std::char_traits<char>>(stream,pcVar7,(ulong)(uVar4 != 0));
        local_48.id_ = p_clause[uVar4 + 1];
        operator<<(stream,&local_48);
        uVar4 = uVar4 + 1;
      } while (uVar5 != uVar4);
    }
    if (final_token != (char *)0x0) {
      sVar2 = strlen(final_token);
      std::__ostream_insert<char,std::char_traits<char>>(stream,final_token,sVar2);
    }
  }
  else {
    local_40 = (ulong)(uVar1 >> 0x10);
    uVar6 = 0;
    local_38 = uVar5;
    do {
      if ((local_40 & 1) != 0) {
        if ((int)uVar5 != 0) {
          uVar5 = 0;
          do {
            local_44.id_ = (uint)((~uVar6 >> ((uint)uVar5 & 0x1f) & 1) != 0) ^ p_clause[uVar5 + 1];
            pcVar7 = "";
            if (uVar5 != 0) {
              pcVar7 = " ";
            }
            std::__ostream_insert<char,std::char_traits<char>>(stream,pcVar7,(ulong)(uVar5 != 0));
            operator<<(stream,&local_44);
            uVar5 = uVar5 + 1;
          } while ((uVar1 & 0xffff) != uVar5);
        }
        uVar5 = local_38;
        if (final_token != (char *)0x0) {
          sVar2 = strlen(final_token);
          std::__ostream_insert<char,std::char_traits<char>>(stream,final_token,sVar2);
        }
      }
      uVar6 = uVar6 + 1;
      uVar3 = (uint)local_40;
      local_40 = local_40 >> 1 & 0x7fffffff;
    } while (1 < uVar3);
  }
  return;
}

Assistant:

inline static void print_clause(std::ostream& stream, const uint32_t* const p_clause, const char* final_token = nullptr) {
            uint16_t clauses_bitmap = *p_clause >> 16;
            const clause_size_t literals_size = (*p_clause & 0xFFFF);
            
            if (literals_size <= 4 && clauses_bitmap != 0) {
                uint16_t clause_bitmap = 0;
                while (clauses_bitmap > 0) {
                    if (clauses_bitmap & 1) {
                        for (auto i = 0; i < literals_size; i++) {
                            literal_t literal(*(p_clause + i + 1));
                            literal.negate((clause_bitmap & (1 << i)) == 0);
                            stream << ((i > 0) ? " " : "") << literal;
                        };
                        
                        if (final_token != nullptr) {
                            stream << final_token;
                        };
                    };
                    clause_bitmap++;
                    clauses_bitmap >>= 1;
                };
            } else {
                for (auto i = 0; i < literals_size; i++) {
                    stream << ((i > 0) ? " " : "") << literal_t(*(p_clause + i + 1));
                };
                
                if (final_token != nullptr) {
                    stream << final_token;
                };
            };
        }